

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_string.c
# Opt level: O2

void ensureStringBufferCanHold(DString *baseString,size_t newStringSize)

{
  ulong uVar1;
  char *pcVar2;
  ulong __size;
  bool bVar3;
  
  __size = baseString->currentStringBufferSize;
  if (baseString->currentStringBufferSize < newStringSize + 1) {
    while (__size < newStringSize + 1) {
      uVar1 = __size + 0x6400000;
      bVar3 = 0x6400000 < __size;
      __size = __size * 2;
      if (bVar3) {
        __size = uVar1;
      }
    }
    pcVar2 = (char *)realloc(baseString->str,__size);
    if (pcVar2 == (char *)0x0) {
      fprintf(_stderr,"Error reallocating memory for d_string. Current buffer size %lu.\n",
              baseString->currentStringBufferSize);
      exit(1);
    }
    baseString->str = pcVar2;
    baseString->currentStringBufferSize = __size;
  }
  return;
}

Assistant:

static void ensureStringBufferCanHold(DString * baseString, size_t newStringSize) {
	if (baseString) {
		size_t newBufferSizeNeeded = newStringSize + 1;

		if (newBufferSizeNeeded > baseString->currentStringBufferSize) {
			size_t newBufferSize = baseString->currentStringBufferSize;

			while (newBufferSizeNeeded > newBufferSize) {
				if (newBufferSize > kStringBufferMaxIncrement) {
					newBufferSize += kStringBufferMaxIncrement;
				} else {
					newBufferSize *= kStringBufferGrowthMultiplier;
				}
			}

			char * temp;
			temp = realloc(baseString->str, newBufferSize);

			if (temp == NULL) {
				/* realloc failed */
				fprintf(stderr, "Error reallocating memory for d_string. Current buffer size %lu.\n", baseString->currentStringBufferSize);

				exit(1);
			}

			baseString->str = temp;
			baseString->currentStringBufferSize = newBufferSize;
		}
	}
}